

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int mmi_ci_train(model_inventory_t *inv,model_def_t *mdef,lexicon_t *lex,vector_t **f,
                s3lattice_t *lat,float64 a_beam,uint32 mean_reest,uint32 var_reest,feat_t *fcb)

{
  s3arc_s *psVar1;
  model_inventory_t *pmVar2;
  int32 iVar3;
  uint uVar4;
  vector_t **pppfVar5;
  ulong uVar6;
  state_t *psVar7;
  int iVar8;
  ulong uVar9;
  uint32 n_state;
  ulong local_68;
  uint32 local_5c;
  model_inventory_t *local_58;
  model_def_t *local_50;
  lexicon_t *local_48;
  float64 local_40;
  float64 log_lik;
  
  n_state = 0;
  local_5c = mean_reest;
  local_58 = inv;
  local_50 = mdef;
  local_48 = lex;
  local_40 = a_beam;
  printf(" %5u",(ulong)lat->n_arcs);
  if (lat->n_arcs != 0) {
    uVar9 = 0;
    do {
      iVar8 = lat->arc[uVar9].ef - lat->arc[uVar9].sf;
      uVar4 = iVar8 + 1;
      local_68 = uVar9;
      pppfVar5 = (vector_t **)
                 __ckd_calloc__((ulong)uVar4,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                ,0x5a3);
      pmVar2 = local_58;
      if (iVar8 != -1) {
        uVar6 = 0;
        do {
          pppfVar5[uVar6] = f[(lat->arc[uVar9].sf + (int)uVar6) - 1];
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      psVar7 = next_utt_states(&n_state,local_48,local_58,local_50,lat->arc[uVar9].word);
      iVar3 = mmi_viterbi_run(&log_lik,pppfVar5,uVar4,psVar7,n_state,pmVar2,local_40);
      if (iVar3 == 0) {
        psVar1 = lat->arc;
        psVar1[uVar9].good_arc = 1;
        psVar1[uVar9].ac_score = log_lik;
      }
      ckd_free(pppfVar5);
      uVar6 = local_68 + 1;
      if (lat->arc[uVar9].good_arc == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                ,0x5b7,"arc_%d is ignored (viterbi run failed)\n",uVar6 & 0xffffffff);
      }
      uVar9 = uVar6;
    } while (uVar6 < lat->n_arcs);
  }
  lat_fwd_bwd(lat);
  uVar4 = lat->n_arcs;
  if (uVar4 != 0) {
    uVar9 = 0;
    do {
      psVar1 = lat->arc;
      if (psVar1[uVar9].good_arc == 1) {
        iVar8 = psVar1[uVar9].ef - psVar1[uVar9].sf;
        uVar4 = iVar8 + 1;
        local_68 = uVar9;
        pppfVar5 = (vector_t **)
                   __ckd_calloc__((ulong)uVar4,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                                  ,0x5c6);
        pmVar2 = local_58;
        if (iVar8 != -1) {
          uVar6 = 0;
          do {
            pppfVar5[uVar6] = f[(lat->arc[uVar9].sf + (int)uVar6) - 1];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        psVar7 = next_utt_states(&n_state,local_48,local_58,local_50,lat->arc[uVar9].word);
        iVar3 = mmi_viterbi_update(pppfVar5,uVar4,psVar7,n_state,pmVar2,local_40,local_5c,var_reest,
                                   lat->arc[uVar9].gamma,fcb);
        uVar9 = local_68;
        if (iVar3 != 0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/main.c"
                  ,0x5d6,"arc_%d is ignored (viterbi update failed)\n",(ulong)((int)local_68 + 1));
        }
        ckd_free(pppfVar5);
        uVar4 = lat->n_arcs;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar4);
  }
  return 0;
}

Assistant:

int
mmi_ci_train(model_inventory_t *inv,
	     model_def_t *mdef,
	     lexicon_t *lex,
	     vector_t **f,
	     s3lattice_t *lat,
	     float64 a_beam,
	     uint32 mean_reest,
	     uint32 var_reest,
	     feat_t *fcb)
{
  uint32 k, n;
  vector_t **arc_f = NULL;/* feature vector for a word arc */
  uint32 n_word_obs;/* frames of a word arc */
  state_t *state_seq;/* HMM state sequence for an arc */
  uint32 n_state = 0;/* number of HMM states */
  float64 log_lik;/* log-likelihood of an arc */
  
  /* viterbi run on each arc */
  printf(" %5u", lat->n_arcs);

  for(n=0; n<lat->n_arcs; n++) {
    
    /* total observations of this arc */
    /* this is not very accurate, as it consumes one more frame for each word at the end */
    n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
    
    /* get the feature for this arc */
    arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
    for (k=0; k<n_word_obs; k++)
      arc_f[k] = f[k+lat->arc[n].sf-1];
    
    /* make state list */
    state_seq = next_utt_states(&n_state, lex, inv, mdef, lat->arc[n].word);
    
    /* viterbi compuation to get the acoustic score for a word hypothesis */
    if (mmi_viterbi_run(&log_lik,
			arc_f, n_word_obs,
			state_seq, n_state,
			inv,
			a_beam) == S3_SUCCESS) {
      lat->arc[n].good_arc = 1;
      lat->arc[n].ac_score = log_lik;
    }
    
    ckd_free(arc_f);
    
    if (lat->arc[n].good_arc == 0) {
      E_INFO("arc_%d is ignored (viterbi run failed)\n", n+1);
    }
  }
  
  /* lattice-based forward-backward computation */
  lat_fwd_bwd(lat);
  
  /* update Gaussian parameters */
  for (n=0; n<lat->n_arcs; n++) {
    
    /* only if the arc was successful in viterbi run */
    if (lat->arc[n].good_arc == 1) {
      
      /* total observations of this arc */
      n_word_obs = lat->arc[n].ef - lat->arc[n].sf + 1;
      arc_f = (vector_t **) ckd_calloc(n_word_obs, sizeof(vector_t *));
      for (k=0; k<n_word_obs; k++)
	arc_f[k] = f[k+lat->arc[n].sf-1];
      
      /* make state list */
      state_seq = next_utt_states(&n_state, lex, inv, mdef, lat->arc[n].word);
      
      /* viterbi update model parameters */
      if (mmi_viterbi_update(arc_f, n_word_obs,
			     state_seq, n_state,
			     inv,
			     a_beam,
			     mean_reest,
			     var_reest,
			     lat->arc[n].gamma,
			     fcb) != S3_SUCCESS) {
	E_ERROR("arc_%d is ignored (viterbi update failed)\n", n+1);
      }
      
      ckd_free(arc_f);
    }
  }
  
  return S3_SUCCESS;
}